

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall
Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
write_to_stream(Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,ostream *os)

{
  size_type sVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  uint local_1c;
  uint i;
  ostream *os_local;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
    if (sVar1 <= local_1c) break;
    pcVar4 = "";
    if (local_1c != 0) {
      pcVar4 = " ";
    }
    poVar2 = std::operator<<(os,pcVar4);
    pbVar3 = operator[](this,local_1c);
    std::operator<<(poVar2,(string *)pbVar3);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Vec<T>::write_to_stream( std::ostream &os ) const {
    for( unsigned i = 0; i < this->size(); ++i )
        os << ( i ? " " : "" ) << this->operator[]( i );
}